

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createLoad(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *node;
  PSNodesSeq *pPVar1;
  
  node = createInternalLoad(this,Inst);
  pPVar1 = addNode(this,(Value *)Inst,node);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createLoad(const llvm::Instruction *Inst) {
    return addNode(Inst, createInternalLoad(Inst));
}